

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa_crypt.cc
# Opt level: O2

int RSA_padding_add_PKCS1_OAEP_mgf1
              (uint8_t *to,size_t to_len,uint8_t *from,size_t from_len,uint8_t *param,
              size_t param_len,EVP_MD *md,EVP_MD *mgf1md)

{
  ulong uVar1;
  uchar *buf;
  int iVar2;
  int iVar3;
  size_t i;
  undefined4 extraout_var;
  uchar *mask;
  size_t sVar4;
  uchar *md_00;
  ulong uVar5;
  size_t __n;
  int iVar6;
  size_t size;
  uint8_t seedmask [64];
  ulong seedlen;
  
  if (md == (EVP_MD *)0x0) {
    md = (EVP_MD *)EVP_sha1();
  }
  if (mgf1md == (EVP_MD *)0x0) {
    mgf1md = md;
  }
  iVar2 = EVP_MD_size((EVP_MD *)md);
  seedlen = CONCAT44(extraout_var,iVar2);
  if (to_len < seedlen * 2 + 2) {
    iVar2 = 0x7e;
    iVar6 = 0x3a;
LAB_00402b8f:
    ERR_put_error(4,0,iVar2,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/rsa/rsa_crypt.cc"
                  ,iVar6);
    return 0;
  }
  uVar5 = ~(seedlen * 2);
  if ((to_len + uVar5) - 1 < from_len) {
    iVar2 = 0x72;
    iVar6 = 0x40;
    goto LAB_00402b8f;
  }
  uVar1 = to_len - 1;
  if (uVar1 <= seedlen * 2) {
    iVar2 = 0x7e;
    iVar6 = 0x45;
    goto LAB_00402b8f;
  }
  *to = '\0';
  md_00 = to + seedlen + 1;
  mask = (uchar *)0x0;
  iVar3 = EVP_Digest(param,param_len,md_00,(uint *)0x0,(EVP_MD *)md,(ENGINE *)0x0);
  iVar6 = 0;
  if (iVar3 == 0) goto LAB_00402be4;
  __n = uVar5 + (uVar1 - from_len);
  if (__n != 0) {
    memset(md_00 + seedlen,0,__n);
  }
  buf = to + 1;
  md_00[~seedlen + (uVar1 - from_len)] = '\x01';
  if (from_len != 0) {
    memcpy(to + (to_len - from_len),from,from_len);
  }
  iVar2 = RAND_bytes(buf,iVar2);
  if (iVar2 == 0) {
    mask = (uchar *)0x0;
  }
  else {
    size = uVar1 - seedlen;
    mask = (uchar *)OPENSSL_malloc(size);
    iVar6 = 0;
    if (mask == (uchar *)0x0) {
      mask = (uchar *)0x0;
      goto LAB_00402be4;
    }
    iVar2 = PKCS1_MGF1(mask,size,buf,seedlen,(EVP_MD *)mgf1md);
    iVar6 = 0;
    if (iVar2 == 0) goto LAB_00402be4;
    for (sVar4 = 0; size != sVar4; sVar4 = sVar4 + 1) {
      md_00[sVar4] = md_00[sVar4] ^ mask[sVar4];
    }
    iVar2 = PKCS1_MGF1(seedmask,seedlen,md_00,size,(EVP_MD *)mgf1md);
    if (iVar2 != 0) {
      iVar6 = 1;
      for (uVar5 = 0; seedlen != uVar5; uVar5 = uVar5 + 1) {
        buf[uVar5] = buf[uVar5] ^ seedmask[uVar5];
      }
      goto LAB_00402be4;
    }
  }
  iVar6 = 0;
LAB_00402be4:
  OPENSSL_free(mask);
  return iVar6;
}

Assistant:

int RSA_padding_add_PKCS1_OAEP_mgf1(uint8_t *to, size_t to_len,
                                    const uint8_t *from, size_t from_len,
                                    const uint8_t *param, size_t param_len,
                                    const EVP_MD *md, const EVP_MD *mgf1md) {
  if (md == NULL) {
    md = EVP_sha1();
  }
  if (mgf1md == NULL) {
    mgf1md = md;
  }

  size_t mdlen = EVP_MD_size(md);

  if (to_len < 2 * mdlen + 2) {
    OPENSSL_PUT_ERROR(RSA, RSA_R_KEY_SIZE_TOO_SMALL);
    return 0;
  }

  size_t emlen = to_len - 1;
  if (from_len > emlen - 2 * mdlen - 1) {
    OPENSSL_PUT_ERROR(RSA, RSA_R_DATA_TOO_LARGE_FOR_KEY_SIZE);
    return 0;
  }

  if (emlen < 2 * mdlen + 1) {
    OPENSSL_PUT_ERROR(RSA, RSA_R_KEY_SIZE_TOO_SMALL);
    return 0;
  }

  to[0] = 0;
  uint8_t *seed = to + 1;
  uint8_t *db = to + mdlen + 1;

  uint8_t *dbmask = NULL;
  int ret = 0;
  if (!EVP_Digest(param, param_len, db, NULL, md, NULL)) {
    goto out;
  }
  OPENSSL_memset(db + mdlen, 0, emlen - from_len - 2 * mdlen - 1);
  db[emlen - from_len - mdlen - 1] = 0x01;
  OPENSSL_memcpy(db + emlen - from_len - mdlen, from, from_len);
  if (!RAND_bytes(seed, mdlen)) {
    goto out;
  }

  dbmask = reinterpret_cast<uint8_t *>(OPENSSL_malloc(emlen - mdlen));
  if (dbmask == NULL) {
    goto out;
  }

  if (!PKCS1_MGF1(dbmask, emlen - mdlen, seed, mdlen, mgf1md)) {
    goto out;
  }
  for (size_t i = 0; i < emlen - mdlen; i++) {
    db[i] ^= dbmask[i];
  }

  uint8_t seedmask[EVP_MAX_MD_SIZE];
  if (!PKCS1_MGF1(seedmask, mdlen, db, emlen - mdlen, mgf1md)) {
    goto out;
  }
  for (size_t i = 0; i < mdlen; i++) {
    seed[i] ^= seedmask[i];
  }
  ret = 1;

out:
  OPENSSL_free(dbmask);
  return ret;
}